

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_builder.cpp
# Opt level: O0

Offset<MyGame::Example::Monster> populate1(FlatBufferBuilder *builder)

{
  FlatBufferBuilder *_fbb;
  Color color;
  Offset<MyGame::Example::Monster> OVar1;
  float nan_default;
  float inf_default;
  float positive_inf_default;
  float infinity_default;
  float positive_infinity_default;
  float fVar2;
  float fVar3;
  double double_inf_default;
  Offset<flatbuffers::Vector<flatbuffers::Offset<MyGame::Example::Stat>,_unsigned_int>_> local_e0;
  Offset<flatbuffers::Vector<unsigned_char,_unsigned_int>_> local_dc;
  Offset<flatbuffers::Vector<unsigned_char,_unsigned_int>_> local_d8;
  Offset<void> local_d4;
  Offset<void> local_d0;
  Offset<flatbuffers::Vector<unsigned_long,_unsigned_int>_> local_cc;
  Offset<flatbuffers::Vector<unsigned_long,_unsigned_int>_> local_c8;
  Offset<flatbuffers::Vector<flatbuffers::Offset<MyGame::Example::Referrable>,_unsigned_int>_>
  local_c4;
  Offset<flatbuffers::Vector<unsigned_long,_unsigned_int>_> local_c0;
  Offset<flatbuffers::Vector<flatbuffers::Offset<MyGame::Example::Referrable>,_unsigned_int>_>
  local_bc;
  Offset<MyGame::InParentNamespace> local_b8;
  Offset<flatbuffers::Vector<double,_unsigned_int>_> local_b4;
  Offset<flatbuffers::Vector<long,_unsigned_int>_> local_b0;
  Offset<flatbuffers::Vector<const_MyGame::Example::Test_*,_unsigned_int>_> local_ac;
  Offset<flatbuffers::Vector<unsigned_char,_unsigned_int>_> local_a8;
  Offset<flatbuffers::Vector<const_MyGame::Example::Ability_*,_unsigned_int>_> local_a4;
  Offset<flatbuffers::Vector<flatbuffers::Offset<flatbuffers::String>,_unsigned_int>_> local_a0;
  Offset<flatbuffers::Vector<unsigned_char,_unsigned_int>_> local_9c;
  Offset<MyGame::Example::Stat> local_98;
  Offset<flatbuffers::Vector<unsigned_char,_unsigned_int>_> local_94;
  Offset<MyGame::Example::Monster> local_90;
  Offset<flatbuffers::Vector<flatbuffers::Offset<MyGame::Example::Monster>,_unsigned_int>_> local_8c
  ;
  Offset<flatbuffers::Vector<flatbuffers::Offset<flatbuffers::String>,_unsigned_int>_> local_88;
  Offset<flatbuffers::Vector<const_MyGame::Example::Test_*,_unsigned_int>_> local_84;
  Offset<void> local_80;
  Offset<flatbuffers::Vector<unsigned_char,_unsigned_int>_> local_7c;
  Offset<flatbuffers::String> local_78;
  string local_68;
  offset_type local_44;
  FlatBufferBuilder *pFStack_40;
  Offset<flatbuffers::String> name_offset;
  FlatBufferBuilder *builder_local;
  
  pFStack_40 = builder;
  m1_name_abi_cxx11_();
  local_44 = (offset_type)
             flatbuffers::FlatBufferBuilderImpl<false>::CreateString<flatbuffers::Offset>
                       (builder,&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  _fbb = pFStack_40;
  local_78.o = local_44;
  flatbuffers::Offset<flatbuffers::Vector<unsigned_char,_unsigned_int>_>::Offset(&local_7c,0);
  color = m1_color();
  flatbuffers::Offset<void>::Offset(&local_80,0);
  flatbuffers::Offset<flatbuffers::Vector<const_MyGame::Example::Test_*,_unsigned_int>_>::Offset
            (&local_84,0);
  flatbuffers::Offset<flatbuffers::Vector<flatbuffers::Offset<flatbuffers::String>,_unsigned_int>_>
  ::Offset(&local_88,0);
  flatbuffers::
  Offset<flatbuffers::Vector<flatbuffers::Offset<MyGame::Example::Monster>,_unsigned_int>_>::Offset
            (&local_8c,0);
  flatbuffers::Offset<MyGame::Example::Monster>::Offset(&local_90,0);
  flatbuffers::Offset<flatbuffers::Vector<unsigned_char,_unsigned_int>_>::Offset(&local_94,0);
  flatbuffers::Offset<MyGame::Example::Stat>::Offset(&local_98,0);
  flatbuffers::Offset<flatbuffers::Vector<unsigned_char,_unsigned_int>_>::Offset(&local_9c,0);
  flatbuffers::Offset<flatbuffers::Vector<flatbuffers::Offset<flatbuffers::String>,_unsigned_int>_>
  ::Offset(&local_a0,0);
  flatbuffers::Offset<flatbuffers::Vector<const_MyGame::Example::Ability_*,_unsigned_int>_>::Offset
            (&local_a4,0);
  flatbuffers::Offset<flatbuffers::Vector<unsigned_char,_unsigned_int>_>::Offset(&local_a8,0);
  flatbuffers::Offset<flatbuffers::Vector<const_MyGame::Example::Test_*,_unsigned_int>_>::Offset
            (&local_ac,0);
  flatbuffers::Offset<flatbuffers::Vector<long,_unsigned_int>_>::Offset(&local_b0,0);
  flatbuffers::Offset<flatbuffers::Vector<double,_unsigned_int>_>::Offset(&local_b4,0);
  flatbuffers::Offset<MyGame::InParentNamespace>::Offset(&local_b8,0);
  flatbuffers::
  Offset<flatbuffers::Vector<flatbuffers::Offset<MyGame::Example::Referrable>,_unsigned_int>_>::
  Offset(&local_bc,0);
  flatbuffers::Offset<flatbuffers::Vector<unsigned_long,_unsigned_int>_>::Offset(&local_c0,0);
  flatbuffers::
  Offset<flatbuffers::Vector<flatbuffers::Offset<MyGame::Example::Referrable>,_unsigned_int>_>::
  Offset(&local_c4,0);
  flatbuffers::Offset<flatbuffers::Vector<unsigned_long,_unsigned_int>_>::Offset(&local_c8,0);
  flatbuffers::Offset<flatbuffers::Vector<unsigned_long,_unsigned_int>_>::Offset(&local_cc,0);
  flatbuffers::Offset<void>::Offset(&local_d0,0);
  flatbuffers::Offset<void>::Offset(&local_d4,0);
  flatbuffers::Offset<flatbuffers::Vector<unsigned_char,_unsigned_int>_>::Offset(&local_d8,0);
  flatbuffers::Offset<flatbuffers::Vector<unsigned_char,_unsigned_int>_>::Offset(&local_dc,0);
  flatbuffers::
  Offset<flatbuffers::Vector<flatbuffers::Offset<MyGame::Example::Stat>,_unsigned_int>_>::Offset
            (&local_e0,0);
  nan_default = std::numeric_limits<float>::quiet_NaN();
  inf_default = std::numeric_limits<float>::infinity();
  positive_inf_default = std::numeric_limits<float>::infinity();
  infinity_default = std::numeric_limits<float>::infinity();
  positive_infinity_default = std::numeric_limits<float>::infinity();
  fVar2 = std::numeric_limits<float>::infinity();
  fVar3 = std::numeric_limits<float>::infinity();
  double_inf_default = std::numeric_limits<double>::infinity();
  OVar1 = MyGame::Example::CreateMonster
                    (_fbb,(Vec3 *)0x0,0,0,local_78,local_7c,color,Any_MIN,local_80,local_84,local_88
                     ,local_8c,local_90,local_94,local_98,false,0,0,0,0,0,0,0,0,local_9c,3.14159,3.0
                     ,0.0,local_a0,local_a4,local_a8,local_ac,local_b0,local_b4,local_b8,local_bc,0,
                     local_c0,local_c4,0,local_c8,0,local_cc,AnyUniqueAliases_MIN,local_d0,
                     AnyAmbiguousAliases_MIN,local_d4,local_d8,Race_MIN,local_dc,local_e0,
                     (Test *)0x0,LongEnum_NONE,LongEnum_LongOne,nan_default,inf_default,
                     positive_inf_default,infinity_default,positive_infinity_default,-fVar2,-fVar3,
                     double_inf_default);
  return (Offset<MyGame::Example::Monster>)OVar1.o;
}

Assistant:

flatbuffers::Offset<Monster> populate1(
    flatbuffers::FlatBufferBuilder &builder) {
  auto name_offset = builder.CreateString(m1_name());
  return CreateMonster(builder, nullptr, 0, 0, name_offset, 0, m1_color());
}